

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

bool CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Parse
               (ConstStringParam name,TreeEnsembleParameters_TreeNode_TreeNodeBehavior *value)

{
  bool bVar1;
  int int_value;
  StringPiece local_20;
  
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_20,name);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((EnumEntry *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,7,
                     local_20,&int_value);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, TreeEnsembleParameters_TreeNode_TreeNodeBehavior* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries, 7, name, &int_value);
  if (success) {
    *value = static_cast<TreeEnsembleParameters_TreeNode_TreeNodeBehavior>(int_value);
  }
  return success;
}